

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsets.hpp
# Opt level: O2

iterator_range<burst::subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
* __thiscall
burst::subsets<std::initializer_list<int>&,std::greater<void>>
          (iterator_range<burst::subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
           *__return_storage_ptr__,undefined8 param_2,undefined8 param_3,
          subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
          *param_4)

{
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  begin;
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_128;
  int *local_e8;
  int *piStack_e0;
  _Vector_base<const_int_*,_std::allocator<const_int_*>_> local_d8;
  undefined8 uStack_c0;
  int *local_a8;
  int *piStack_a0;
  _Vector_base<const_int_*,_std::allocator<const_int_*>_> local_98;
  undefined8 uStack_80;
  int *local_68;
  int *piStack_60;
  _Vector_base<const_int_*,_std::allocator<const_int_*>_> local_58;
  undefined8 uStack_40;
  
  make_subset_iterator<std::initializer_list<int>&,std::greater<void>>(&local_a8);
  local_68 = local_a8;
  piStack_60 = piStack_a0;
  local_e8 = local_a8;
  piStack_e0 = piStack_a0;
  local_d8._M_impl.super__Vector_impl_data._M_start =
       local_98._M_impl.super__Vector_impl_data._M_start;
  local_d8._M_impl.super__Vector_impl_data._M_finish =
       local_98._M_impl.super__Vector_impl_data._M_finish;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_98._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_c0 = uStack_80;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.m_begin = local_a8;
  local_128.m_end = piStack_a0;
  local_128.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.m_subset_size = 0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_40 = 0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  boost::
  make_iterator_range<burst::subset_iterator<int_const*,std::greater<void>,std::vector<int_const*,std::allocator<int_const*>>>>
            (__return_storage_ptr__,(boost *)&local_e8,&local_128,param_4);
  std::_Vector_base<const_int_*,_std::allocator<const_int_*>_>::~_Vector_base
            (&local_128.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>);
  std::_Vector_base<const_int_*,_std::allocator<const_int_*>_>::~_Vector_base(&local_d8);
  std::_Vector_base<const_int_*,_std::allocator<const_int_*>_>::~_Vector_base(&local_58);
  std::_Vector_base<const_int_*,_std::allocator<const_int_*>_>::~_Vector_base(&local_98);
  return __return_storage_ptr__;
}

Assistant:

auto subsets (ForwardRange && range, Compare compare)
    {
        auto begin = make_subset_iterator(std::forward<ForwardRange>(range), compare);
        auto end = make_subset_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }